

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MGraph.c
# Opt level: O1

void BFS(Graph G)

{
  uint uVar1;
  long lVar2;
  int *piVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  int visited [100];
  int queue [100];
  int local_358 [100];
  uint auStack_1c8 [102];
  
  uVar5 = (ulong)visited[0x13];
  if (0 < (long)uVar5) {
    memset(local_358,0,uVar5 * 4);
  }
  lVar10 = 0;
  printf("BFS: ");
  if (0 < visited[0x13]) {
    uVar11 = 0;
    iVar6 = 0;
    do {
      if (local_358[uVar11] == 0) {
        local_358[uVar11] = 1;
        putchar((int)*(char *)((long)visited + (uVar11 - 0x18)));
        lVar2 = (long)iVar6;
        iVar6 = iVar6 + 1;
        auStack_1c8[lVar2] = (uint)uVar11;
      }
      if ((int)lVar10 != iVar6) {
        lVar10 = (long)(int)lVar10;
        do {
          uVar1 = auStack_1c8[lVar10];
          uVar9 = 0xffffffff;
          if (uVar1 < (uint)visited[0x13]) {
            uVar4 = 0;
            do {
              if (visited[(ulong)uVar1 * 100 + uVar4 + 0x15] == 1) {
                uVar9 = uVar4 & 0xffffffff;
                break;
              }
              uVar4 = uVar4 + 1;
            } while (uVar5 != uVar4);
          }
          iVar7 = (int)uVar9;
          while (-1 < iVar7) {
            if (local_358[uVar9] == 0) {
              local_358[uVar9] = 1;
              putchar((int)*(char *)((long)visited + (uVar9 - 0x18)));
              lVar2 = (long)iVar6;
              iVar6 = iVar6 + 1;
              auStack_1c8[lVar2] = (uint)uVar9;
            }
            if ((uVar1 < (uint)visited[0x13]) && ((int)(uint)uVar9 < visited[0x13])) {
              piVar3 = visited + (ulong)uVar1 * 100 + uVar9 + 0x16;
              do {
                uVar8 = (int)uVar9 + 1;
                uVar9 = (ulong)uVar8;
                if (visited[0x13] <= (int)uVar8) goto LAB_001017d1;
                iVar7 = *piVar3;
                piVar3 = piVar3 + 1;
              } while (iVar7 != 1);
            }
            else {
LAB_001017d1:
              uVar9 = 0xffffffff;
            }
            iVar7 = (int)uVar9;
          }
          lVar10 = lVar10 + 1;
        } while (iVar6 != (int)lVar10);
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != uVar5);
  }
  putchar(10);
  return;
}

Assistant:

void BFS(Graph G){
    int head = 0;
    int rear = 0;
    int queue[MAX]; //辅助队列
    int visited[MAX];   //顶点访问标记
    int i,j,k;
    for(i = 0;i < G.vexnum; i++){   //初始化访问数组
        visited[i] = 0;
    }
    printf("BFS: ");
    for(i = 0;i < G.vexnum;i++){
        if(!visited[i]){
            visited[i] = 1;
            printf("%c",G.vexs[i]);
            queue[rear++] = i;  //入队列
        }
        while (head != rear){
            j = queue[head++];  //出队列
            for(k  = first_vertex(G,j); k >= 0;k = next_vertix(G,j,k))   //k是访问的邻接结点
            {
                if(!visited[k]){
                    visited[k] = 1;
                    printf("%c",G.vexs[k]);
                    queue[rear++] = k;
                }
            }
        }
    }
    printf("\n");
}